

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.hpp
# Opt level: O1

bool LoaderLogger::LogErrorMessage
               (string *command_name,string *message,
               vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  bool bVar1;
  LoaderLogger *this;
  string local_50;
  
  this = GetInstance();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"OpenXR-Loader","");
  bVar1 = LogMessage(this,0x1000,1,&local_50,command_name,message,objects);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool LogErrorMessage(const std::string& command_name, const std::string& message,
                                const std::vector<XrSdkLogObjectInfo>& objects = {}) {
        return GetInstance().LogMessage(XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT, XR_LOADER_LOG_MESSAGE_TYPE_GENERAL_BIT,
                                        "OpenXR-Loader", command_name, message, objects);
    }